

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffdtdmll(fitsfile *fptr,char *tdimstr,int colnum,int maxdim,int *naxis,LONGLONG *naxes,
            int *status)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  long lVar3;
  tcolumn *ptVar4;
  long lVar5;
  double dVar6;
  char message [81];
  char *local_98;
  tcolumn *local_90;
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  ptVar4 = fptr->Fptr->tableptr + (uint)colnum;
  if (*tdimstr == '\0') {
    *naxis = 1;
    if (0 < maxdim) {
      *naxes = ptVar4[-1].trepeat;
    }
LAB_00169e06:
    return *status;
  }
  *naxis = 0;
  pcVar2 = strchr(tdimstr,0x28);
  if (pcVar2 != (char *)0x0) {
    lVar5 = 1;
    local_90 = ptVar4;
    do {
      local_98 = pcVar2 + 1;
      dVar6 = strtod(local_98,&local_98);
      __s = local_98;
      lVar3 = (long)(dVar6 + 0.1);
      iVar1 = *naxis;
      if (iVar1 < maxdim) {
        naxes[iVar1] = lVar3;
      }
      if (lVar3 < 0) {
        ffpmsg("one or more TDIM values are less than 0 (ffdtdm)");
        ffpmsg(tdimstr);
        goto LAB_00169e3e;
      }
      lVar5 = lVar5 * lVar3;
      *naxis = iVar1 + 1;
      pcVar2 = strchr(local_98,0x2c);
    } while (pcVar2 != (char *)0x0);
    local_98 = pcVar2;
    pcVar2 = strchr(__s,0x29);
    if (pcVar2 != (char *)0x0) {
      if ((0 < local_90[-1].tdatatype) && (local_90[-1].trepeat != lVar5)) {
        snprintf(local_88,0x51,"column vector length, %.0f, does not equal TDIMn array size, %.0f",
                 (double)local_90[-1].trepeat,(double)lVar5);
        ffpmsg(local_88);
        ffpmsg(tdimstr);
        *status = 0x107;
        return 0x107;
      }
      goto LAB_00169e06;
    }
  }
  snprintf(local_88,0x51,"Illegal TDIM keyword value: %s",tdimstr);
LAB_00169e3e:
  *status = 0x107;
  return 0x107;
}

Assistant:

int ffdtdmll(fitsfile *fptr,  /* I - FITS file pointer                        */
           char *tdimstr,   /* I - TDIMn keyword value string. e.g. (10,10) */
           int colnum,      /* I - number of the column             */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           int *status)     /* IO - error status                            */
/*
  decode the TDIMnnn keyword to get the dimensionality of a column.
  Check that the value is legal and consistent with the TFORM value.
*/
{
    LONGLONG dimsize;
    LONGLONG totalpix = 1;
    char *loc, *lastloc, message[FLEN_ERRMSG];
    tcolumn *colptr;
    double doublesize;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);    /* increment to the correct column */

    if (!tdimstr[0])   /* TDIMn keyword doesn't exist? */
    {
        *naxis = 1;                   /* default = 1 dimensional */
        if (maxdim > 0)
            naxes[0] = colptr->trepeat; /* default length = repeat */
    }
    else
    {
        *naxis = 0;

        loc = strchr(tdimstr, '(' );  /* find the opening quote */
        if (!loc)
        {
            snprintf(message, FLEN_ERRMSG, "Illegal TDIM keyword value: %s", tdimstr);
            return(*status = BAD_TDIM);
        }

        while (loc)
        {
            loc++;

    /* Read value as a double because the string to 64-bit int function is  */
    /* platform dependent (strtoll, strtol, _atoI64).  This still gives     */
    /* about 48 bits of precision, which is plenty for this purpose.        */

            doublesize = strtod(loc, &loc);
            dimsize = (LONGLONG) (doublesize + 0.1);

            if (*naxis < maxdim)
                naxes[*naxis] = dimsize;

            if (dimsize < 0)
            {
                ffpmsg("one or more TDIM values are less than 0 (ffdtdm)");
                ffpmsg(tdimstr);
                return(*status = BAD_TDIM);
            }

            totalpix *= dimsize;
            (*naxis)++;
            lastloc = loc;
            loc = strchr(loc, ',');  /* look for comma before next dimension */
        }

        loc = strchr(lastloc, ')' );  /* check for the closing quote */
        if (!loc)
        {
            snprintf(message, FLEN_ERRMSG, "Illegal TDIM keyword value: %s", tdimstr);
            return(*status = BAD_TDIM);
        }

        if ((colptr->tdatatype > 0) && (colptr->trepeat != totalpix))
        {
          snprintf(message, FLEN_ERRMSG,
          "column vector length, %.0f, does not equal TDIMn array size, %.0f",
          (double) (colptr->trepeat), (double) totalpix);
          ffpmsg(message);
          ffpmsg(tdimstr);
          return(*status = BAD_TDIM);
        }
    }
    return(*status);
}